

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O0

bool CLI::detail::is_separator(string *str)

{
  byte bVar1;
  int iVar2;
  __type local_31;
  allocator local_11;
  string *local_10;
  string *str_local;
  
  local_10 = str;
  if (is_separator(std::__cxx11::string_const&)::sep_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&is_separator(std::__cxx11::string_const&)::sep_abi_cxx11_);
    if (iVar2 != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&is_separator(std::__cxx11::string_const&)::sep_abi_cxx11_,"%%",&local_11
                );
      ::std::allocator<char>::~allocator((allocator<char> *)&local_11);
      __cxa_atexit(::std::__cxx11::string::~string,
                   &is_separator(std::__cxx11::string_const&)::sep_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&is_separator(std::__cxx11::string_const&)::sep_abi_cxx11_);
    }
  }
  bVar1 = ::std::__cxx11::string::empty();
  local_31 = true;
  if ((bVar1 & 1) == 0) {
    local_31 = ::std::operator==(local_10,&is_separator(std::__cxx11::string_const&)::sep_abi_cxx11_
                                );
  }
  return local_31;
}

Assistant:

inline bool is_separator(const std::string &str) {
    static const std::string sep("%%");
    return (str.empty() || str == sep);
}